

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

iterator * __thiscall
rangeless::fn::impl::
seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
::iterator::operator++(iterator *this)

{
  bool *pbVar1;
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  *psVar2;
  maybe<rangeless::fn::impl::X> in_RAX;
  bool *pbVar3;
  anon_union_4_2_edcbc2ec_for_maybe<rangeless::fn::impl::X>_1 local_28;
  bool local_24 [4];
  
  psVar2 = this->m_parent;
  if ((psVar2 == (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
                  *)0x0) || (psVar2->m_ended != false)) goto LAB_001766db;
  pbVar1 = &(psVar2->m_current).m_empty;
  _local_28 = in_RAX;
  group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::
  gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  ::subgen::operator()((subgen *)&local_28);
  if (psVar2 != (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
                 *)&local_28) {
    if (local_24[0] == false) {
      if (*pbVar1 == false) {
        *pbVar1 = true;
      }
      (psVar2->m_current).field_0 = local_28;
      (psVar2->m_current).m_empty = false;
      pbVar3 = local_24;
    }
    else {
      pbVar3 = pbVar1;
      if (*pbVar1 != false) goto LAB_001766cf;
    }
    *pbVar3 = true;
  }
LAB_001766cf:
  if (*pbVar1 != true) {
    return this;
  }
  psVar2->m_ended = true;
LAB_001766db:
  this->m_parent =
       (seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
        *)0x0;
  return this;
}

Assistant:

iterator& operator++()
            {
                if(!m_parent || m_parent->m_ended) {
                    m_parent = nullptr;
                    return *this;
                }

                auto& p = *m_parent;

                if(p.m_current) {
                    impl::recycle(p.m_gen, *p.m_current, resolve_overload{});
                }

                p.m_current = p.m_gen();

                if(!p.m_current) {
                    p.m_ended = true;
                    m_parent = nullptr; // reached end
                }
                return *this;
            }